

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O1

Ray * __thiscall phyr::Transform::operator()(Transform *this,Ray *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  uint uVar11;
  Ray *in_RDI;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double local_88;
  
  dVar1 = (this->mat).d[0][0];
  dVar2 = (r->o).x;
  dVar27 = (r->o).y;
  dVar13 = (this->mat).d[0][1];
  dVar3 = (this->mat).d[0][2];
  dVar4 = (r->o).z;
  dVar5 = (this->mat).d[0][3];
  dVar6 = (this->mat).d[1][0];
  dVar7 = (this->mat).d[1][2];
  dVar12 = (this->mat).d[3][2] * dVar4 + (this->mat).d[3][0] * dVar2 + (this->mat).d[3][1] * dVar27
           + (this->mat).d[3][3];
  dVar8 = (this->mat).d[1][3];
  uVar11 = -(uint)(dVar12 == 1.0) & 1;
  dVar25 = 1.0 / dVar12;
  dVar26 = (this->mat).d[1][1];
  dVar14 = dVar27 * dVar13;
  dVar15 = dVar27 * dVar26;
  dVar19 = dVar5 + dVar4 * dVar3 + dVar2 * dVar1 + dVar14;
  dVar21 = dVar8 + dVar4 * dVar7 + dVar2 * dVar6 + dVar15;
  dVar17 = (this->mat).d[2][1];
  dVar27 = dVar27 * dVar17;
  dVar22 = (this->mat).d[2][0];
  dVar23 = dVar22 * dVar2;
  dVar9 = (this->mat).d[2][2];
  dVar18 = dVar9 * dVar4;
  dVar10 = (this->mat).d[2][3];
  dVar24 = dVar23 + dVar27 + dVar18 + dVar10;
  local_88 = dVar24 * dVar25;
  auVar16._0_8_ = CONCAT44((int)(uVar11 << 0x1f) >> 0x1f,(int)(uVar11 << 0x1f) >> 0x1f);
  auVar16._8_4_ = (int)(uVar11 << 0x1f) >> 0x1f;
  auVar16._12_4_ = (int)(uVar11 << 0x1f) >> 0x1f;
  if ((dVar12 == 1.0) && (!NAN(dVar12))) {
    local_88 = dVar24;
  }
  dVar20 = (double)((ulong)dVar19 & auVar16._0_8_ | ~auVar16._0_8_ & (ulong)(dVar25 * dVar19));
  dVar25 = (double)((ulong)dVar21 & auVar16._8_8_ | ~auVar16._8_8_ & (ulong)(dVar25 * dVar21));
  dVar12 = (r->d).x;
  dVar19 = (r->d).y;
  dVar21 = (r->d).z;
  dVar13 = dVar3 * dVar21 + dVar1 * dVar12 + dVar13 * dVar19;
  dVar24 = dVar7 * dVar21 + dVar6 * dVar12 + dVar26 * dVar19;
  dVar17 = dVar22 * dVar12 + dVar17 * dVar19 + dVar9 * dVar21;
  dVar26 = r->tMax;
  dVar22 = dVar17 * dVar17 + dVar13 * dVar13 + dVar24 * dVar24;
  if (0.0 < dVar22) {
    dVar22 = (ABS(dVar17) *
              (ABS(dVar18) + ABS(dVar27) + ABS(dVar23) + ABS(dVar10)) * 3.3306690738754706e-16 +
             ABS(dVar13) *
             (ABS(dVar3 * dVar4) + ABS(dVar14) + ABS(dVar1 * dVar2) + ABS(dVar5)) *
             3.3306690738754706e-16 +
             ABS(dVar24) *
             (ABS(dVar7 * dVar4) + ABS(dVar15) + ABS(dVar6 * dVar2) + ABS(dVar8)) *
             3.3306690738754706e-16) / dVar22;
    dVar26 = dVar26 - dVar22;
    dVar20 = dVar20 + dVar22 * dVar13;
    dVar25 = dVar25 + dVar22 * dVar24;
    local_88 = local_88 + dVar17 * dVar22;
  }
  (in_RDI->o).x = dVar20;
  (in_RDI->o).y = dVar25;
  (in_RDI->o).z = local_88;
  (in_RDI->d).x = dVar13;
  (in_RDI->d).y = dVar24;
  (in_RDI->d).z = dVar17;
  in_RDI->tMax = dVar26;
  return in_RDI;
}

Assistant:

inline Ray Transform::operator()(const Ray& r) const {
    Vector3f roError;

    // Transform ray origin and direction
    Point3f o = (*this)(r.o, &roError);
    Vector3f d = (*this)(r.d);

    Real tMax = r.tMax, lengthSq = d.lengthSquared();
    if (lengthSq > 0) {
        Real factor = dot(abs(d), roError) / lengthSq;
        o += d * factor; tMax -= factor;
    }

    return Ray(o, d, tMax);
}